

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

char * mpoisons_subj(monst *mtmp,attack *mattk)

{
  bool bVar1;
  monst *local_48;
  monst *local_40;
  obj *local_30;
  obj *mwep;
  attack *mattk_local;
  monst *mtmp_local;
  
  if (mattk->aatyp == 0xfe) {
    if (mtmp == &youmonst) {
      local_30 = uwep;
    }
    else {
      local_30 = mtmp->mw;
    }
    bVar1 = true;
    if (local_30 != (obj *)0x0) {
      bVar1 = (*(uint *)&local_30->field_0x4a >> 0xf & 1) == 0;
    }
    mtmp_local = (monst *)0x398291;
    if (bVar1) {
      mtmp_local = (monst *)"attack";
    }
  }
  else {
    if (mattk->aatyp == '\x05') {
      local_40 = (monst *)0x3718f8;
    }
    else {
      if (mattk->aatyp == '\x0f') {
        local_48 = (monst *)0x38346a;
      }
      else {
        local_48 = (monst *)0x381678;
        if (mattk->aatyp == '\x02') {
          local_48 = (monst *)0x371900;
        }
      }
      local_40 = local_48;
    }
    mtmp_local = local_40;
  }
  return (char *)mtmp_local;
}

Assistant:

const char *mpoisons_subj(struct monst *mtmp, const struct attack *mattk)
{
	if (mattk->aatyp == AT_WEAP) {
	    struct obj *mwep = (mtmp == &youmonst) ? uwep : MON_WEP(mtmp);
	    /* "Foo's attack was poisoned." is pretty lame, but at least
	       it's better than "sting" when not a stinging attack... */
	    return (!mwep || !mwep->opoisoned) ? "attack" : "weapon";
	} else {
	    return (mattk->aatyp == AT_TUCH) ? "contact" :
		   (mattk->aatyp == AT_GAZE) ? "gaze" :
		   (mattk->aatyp == AT_BITE) ? "bite" : "sting";
	}
}